

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

bool deqp::gls::BuiltinPrecisionTests::inputLess<tcu::Vector<float,2>>
               (Vector<float,_2> *val1,Vector<float,_2> *val2)

{
  bool bVar1;
  InputLess<tcu::Vector<float,_2>_> local_19;
  Vector<float,_2> *local_18;
  Vector<float,_2> *val2_local;
  Vector<float,_2> *val1_local;
  
  local_18 = val2;
  val2_local = val1;
  bVar1 = InputLess<tcu::Vector<float,_2>_>::operator()(&local_19,val1,val2);
  return bVar1;
}

Assistant:

bool inputLess (const T& val1, const T& val2)
{
	return InputLess<T>()(val1, val2);
}